

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this)

{
  int iVar1;
  Type pRVar2;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  JavascriptWeakSet *pJVar3;
  ulong uVar4;
  int i;
  int iVar5;
  
  pJVar3 = VarTo<Js::JavascriptWeakSet>(this->instance);
  if ((pJVar3->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0) {
    uVar4 = 0;
    do {
      i = (pJVar3->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[uVar4];
      if (i != -1) {
        iVar5 = -1;
        do {
          pRVar2 = (pJVar3->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[i].ptr;
          if (pRVar2 == (Type)0x0) {
            iVar1 = (pJVar3->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(&(pJVar3->keySet).
                        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       ,i,iVar5,(uint)uVar4);
          }
          else {
            this_00 = this->propertyList;
            JsUtil::
            List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,0);
            iVar5 = (this_00->
                    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_00->
            super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar5].value = pRVar2;
            (this_00->
            super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar5 + 1;
            iVar1 = (pJVar3->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            iVar5 = i;
          }
          i = iVar1;
        } while (i != -1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (pJVar3->keySet).
                     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     .bucketCount);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakSet>::GetChildren()
    {
        JavascriptWeakSet* data = VarTo<JavascriptWeakSet>(instance);
        data->Map([&](Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakSet>(value));
        });
    }